

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall Connection::Connection(Connection *this,short port)

{
  int iVar1;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  hostent *local_30;
  hostent *ptrh;
  undefined1 auStack_20 [4];
  sockaddr_in echoServAddr;
  short port_local;
  Connection *this_local;
  
  echoServAddr.sin_zero._2_2_ = port;
  unique0x100001f8 = this;
  iVar1 = socket(2,1,0);
  this->sock = iVar1;
  if (iVar1 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"socket() failed",&local_51);
    myerror((string *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  memset((void *)((long)&ptrh + 4),0,0x10);
  ptrh._4_2_ = 2;
  ptrh._6_2_ = htons(echoServAddr.sin_zero._2_2_);
  local_30 = gethostbyname("localhost");
  memcpy(auStack_20,*local_30->h_addr_list,(long)local_30->h_length);
  iVar1 = connect(this->sock,(sockaddr *)((long)&ptrh + 4),0x10);
  if (iVar1 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"connect() failed",&local_89);
    myerror((string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  return;
}

Assistant:

Connection::Connection(short port) {
#if defined(__linux__) || defined(__APPLE__)
  struct sockaddr_in echoServAddr; /* Echo server address */
  struct  hostent  *ptrh;
  
  /* Create a reliable, stream socket using TCP */
  if ((sock = socket(AF_INET, SOCK_STREAM, 0)) < 0)
    myerror("socket() failed");
  
  /* Construct the server address structure */
  memset(&echoServAddr, 0, sizeof(echoServAddr));     /* Zero out structure */
  echoServAddr.sin_family      = AF_INET;             /* Internet address family */
  echoServAddr.sin_port = htons(port);                /* Server port */

  ptrh = gethostbyname("localhost");

  memcpy(&echoServAddr.sin_addr, ptrh->h_addr, ptrh->h_length);
  
  /* Establish the connection to the echo server */
  if (connect(sock, (struct sockaddr *) &echoServAddr, sizeof(echoServAddr)) < 0)
    myerror("connect() failed");
#else
		WSADATA wsaData;
    int iResult = WSAStartup(MAKEWORD(2,2), &wsaData);
    if (iResult != NO_ERROR)
				printf("Client: Error at WSAStartup().\n");

	// Create a socket.
    sock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
    if (sock == INVALID_SOCKET) {
        printf("Client: socket() - Error at socket(): %d\n", WSAGetLastError());
        WSACleanup();
    }

    // Connect to a server.
    sockaddr_in clientService;
    clientService.sin_family = AF_INET;
    // Just test using the localhost, you can try other IP address
    clientService.sin_addr.s_addr = inet_addr("127.0.0.1");
    clientService.sin_port = htons(port);

    if (connect(sock, (SOCKADDR*)&clientService, sizeof(clientService)) == SOCKET_ERROR) {
        printf("Client: connect() - Failed to connect.\n");
        WSACleanup();
    }
#endif
}